

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O3

parser * init_parse_room(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name str name",parse_room_name);
  parser_reg(p,"type uint type",parse_room_type);
  parser_reg(p,"rating int rating",parse_room_rating);
  parser_reg(p,"rows uint height",parse_room_height);
  parser_reg(p,"columns uint width",parse_room_width);
  parser_reg(p,"doors uint doors",parse_room_doors);
  parser_reg(p,"tval sym tval",parse_room_tval);
  parser_reg(p,"flags str flags",parse_room_flags);
  parser_reg(p,"D str text",parse_room_d);
  return p;
}

Assistant:

static struct parser *init_parse_room(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "name str name", parse_room_name);
	parser_reg(p, "type uint type", parse_room_type);
	parser_reg(p, "rating int rating", parse_room_rating);
	parser_reg(p, "rows uint height", parse_room_height);
	parser_reg(p, "columns uint width", parse_room_width);
	parser_reg(p, "doors uint doors", parse_room_doors);
	parser_reg(p, "tval sym tval", parse_room_tval);
	parser_reg(p, "flags str flags", parse_room_flags);
	parser_reg(p, "D str text", parse_room_d);
	return p;
}